

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O0

void add_teleport_to_golas_heart(ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  initializer_list<md::DataRegister> __l_04;
  uint32_t uVar1;
  Item *pIVar2;
  allocator<char> local_619;
  string local_618;
  allocator<md::AddressRegister> local_5f1;
  AddressRegister local_5f0;
  AddressRegister local_5e0;
  AddressRegister local_5d0;
  AddressRegister local_5c0;
  AddressRegister local_5b0;
  AddressRegister local_5a0;
  AddressRegister local_590;
  iterator local_580;
  size_type local_578;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_570;
  allocator<md::DataRegister> local_551;
  DataRegister local_550;
  DataRegister local_540;
  DataRegister local_530;
  DataRegister local_520;
  DataRegister local_510;
  DataRegister local_500;
  DataRegister local_4f0;
  DataRegister local_4e0;
  iterator local_4d0;
  size_type local_4c8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_4c0;
  DataRegister local_4a8;
  Param local_498 [2];
  Param local_488 [2];
  Param local_478 [2];
  DataRegister local_468;
  allocator<unsigned_char> local_453;
  uchar local_452 [2];
  iterator local_450;
  size_type local_448;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_440;
  Param local_428 [2];
  Param local_418 [2];
  Param local_408 [2];
  Param local_3f8 [2];
  Param local_3e8 [2];
  Param local_3d8 [2];
  Param local_3c8 [2];
  allocator<unsigned_char> local_3b3;
  uchar local_3b2 [2];
  iterator local_3b0;
  size_type local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  allocator<md::AddressRegister> local_381;
  AddressRegister local_380;
  AddressRegister local_370;
  AddressRegister local_360;
  AddressRegister local_350;
  AddressRegister local_340;
  AddressRegister local_330;
  AddressRegister local_320;
  iterator local_310;
  size_type local_308;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_300;
  allocator<md::DataRegister> local_2e1;
  DataRegister local_2e0;
  DataRegister local_2d0;
  DataRegister local_2c0;
  DataRegister local_2b0;
  DataRegister local_2a0;
  DataRegister local_290;
  DataRegister local_280;
  DataRegister local_270;
  iterator local_260;
  size_type local_258;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_250;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  Param local_1e8 [2];
  undefined1 local_1d8 [8];
  Code func_post_use;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  Param local_e8 [2];
  allocator<char> local_d1;
  string local_d0;
  Param local_a0 [2];
  undefined1 local_90 [8];
  Code func_pre_use;
  World *world_local;
  ROM *rom_local;
  
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)world;
  md::Code::Code((Code *)local_90);
  addr_<void>((uint32_t)local_a0,0xff1204);
  md::Code::cmpiw((Code *)local_90,0x326,local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"regular_test",&local_d1);
  md::Code::bne((Code *)local_90,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  addr_<void>((uint32_t)local_e8,0xff5400);
  md::Code::cmpiw((Code *)local_90,0x2514,local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"regular_test",&local_109)
  ;
  md::Code::bne((Code *)local_90,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  md::Code::jmp((Code *)local_90,0x8bb2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"regular_test",&local_131)
  ;
  md::Code::label((Code *)local_90,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'+');
  uVar1 = Item::pre_use_address(pIVar2);
  md::Code::jmp((Code *)local_90,uVar1);
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'+');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"",
             (allocator<char> *)
             ((long)&func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_158);
  (*pIVar2->_vptr_Item[2])(pIVar2,(ulong)uVar1);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  md::Code::Code((Code *)local_1d8);
  addr_<void>((uint32_t)local_1e8,0xff1204);
  md::Code::cmpiw((Code *)local_1d8,0x326,local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"tp_to_golas_heart",&local_209);
  md::Code::beq((Code *)local_1d8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'+');
  uVar1 = Item::post_use_address(pIVar2);
  md::Code::jmp((Code *)local_1d8,uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"tp_to_golas_heart",&local_231);
  md::Code::label((Code *)local_1d8,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  md::DataRegister::DataRegister(&local_2e0,'\0');
  md::DataRegister::DataRegister(&local_2d0,'\x01');
  md::DataRegister::DataRegister(&local_2c0,'\x02');
  md::DataRegister::DataRegister(&local_2b0,'\x03');
  md::DataRegister::DataRegister(&local_2a0,'\x04');
  md::DataRegister::DataRegister(&local_290,'\x05');
  md::DataRegister::DataRegister(&local_280,'\x06');
  md::DataRegister::DataRegister(&local_270,'\a');
  local_260 = &local_2e0;
  local_258 = 8;
  std::allocator<md::DataRegister>::allocator(&local_2e1);
  __l_04._M_len = local_258;
  __l_04._M_array = local_260;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_250,__l_04,&local_2e1);
  md::AddressRegister::AddressRegister(&local_380,'\0');
  md::AddressRegister::AddressRegister(&local_370,'\x01');
  md::AddressRegister::AddressRegister(&local_360,'\x02');
  md::AddressRegister::AddressRegister(&local_350,'\x03');
  md::AddressRegister::AddressRegister(&local_340,'\x04');
  md::AddressRegister::AddressRegister(&local_330,'\x05');
  md::AddressRegister::AddressRegister(&local_320,'\x06');
  local_310 = &local_380;
  local_308 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_381);
  __l_03._M_len = local_308;
  __l_03._M_array = local_310;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_300,__l_03,&local_381);
  md::Code::movem_to_stack((Code *)local_1d8,&local_250,&local_300);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_300);
  std::allocator<md::AddressRegister>::~allocator(&local_381);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_250);
  std::allocator<md::DataRegister>::~allocator(&local_2e1);
  local_3b2[0] = '\0';
  local_3b2[1] = 7;
  local_3b0 = local_3b2;
  local_3a8 = 2;
  std::allocator<unsigned_char>::allocator(&local_3b3);
  __l_02._M_len = local_3a8;
  __l_02._M_array = local_3b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3a0,__l_02,&local_3b3);
  md::Code::trap((Code *)local_1d8,'\0',&local_3a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3a0);
  std::allocator<unsigned_char>::~allocator(&local_3b3);
  md::Code::jsr((Code *)local_1d8,0x29046);
  md::Code::add_word((Code *)local_1d8,0);
  md::Code::jsr((Code *)local_1d8,0x852);
  md::Code::jsr((Code *)local_1d8,0x1592);
  addr_<void>((uint32_t)local_3c8,0xff1052);
  md::Code::andib((Code *)local_1d8,0xf0,local_3c8);
  addr_<void>((uint32_t)local_3d8,0xff1052);
  md::Code::addib((Code *)local_1d8,'\x01',local_3d8);
  addr_<void>((uint32_t)local_3e8,0xff1051);
  md::Code::andib((Code *)local_1d8,'\x0f',local_3e8);
  addr_<void>((uint32_t)local_3f8,0xff1051);
  md::Code::addib((Code *)local_1d8,'\x10',local_3f8);
  addr_<void>((uint32_t)local_408,0xff5400);
  md::Code::movew((Code *)local_1d8,0x2f11,local_408);
  addr_<void>((uint32_t)local_418,0xff5402);
  md::Code::movew((Code *)local_1d8,0x708,local_418);
  addr_<void>((uint32_t)local_428,0xff5404);
  md::Code::moveb((Code *)local_1d8,0x88,local_428);
  local_452[0] = '\0';
  local_452[1] = 0x4d;
  local_450 = local_452;
  local_448 = 2;
  std::allocator<unsigned_char>::allocator(&local_453);
  __l_01._M_len = local_448;
  __l_01._M_array = local_450;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_440,__l_01,&local_453);
  md::Code::trap((Code *)local_1d8,'\0',&local_440);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_440);
  std::allocator<unsigned_char>::~allocator(&local_453);
  md::Code::jsr((Code *)local_1d8,0x44c);
  md::DataRegister::DataRegister(&local_468,'\0');
  md::Code::movew((Code *)local_1d8,0x39,(Param *)&local_468);
  addr_<void>((uint32_t)local_478,0xff5412);
  md::Code::movew((Code *)local_1d8,0,local_478);
  addr_<void>((uint32_t)local_488,0xff5422);
  md::Code::moveb((Code *)local_1d8,'\0',local_488);
  addr_<void>((uint32_t)local_498,0xff5439);
  md::Code::moveb((Code *)local_1d8,'\0',local_498);
  md::Code::jsr((Code *)local_1d8,0x1586e);
  md::Code::jsr((Code *)local_1d8,0x434);
  md::DataRegister::DataRegister(&local_4a8,'\0');
  md::Code::clrb((Code *)local_1d8,(Param *)&local_4a8);
  md::Code::jsr((Code *)local_1d8,0x2824);
  md::Code::jsr((Code *)local_1d8,0x410);
  md::Code::jsr((Code *)local_1d8,0x8eb4);
  md::DataRegister::DataRegister(&local_550,'\0');
  md::DataRegister::DataRegister(&local_540,'\x01');
  md::DataRegister::DataRegister(&local_530,'\x02');
  md::DataRegister::DataRegister(&local_520,'\x03');
  md::DataRegister::DataRegister(&local_510,'\x04');
  md::DataRegister::DataRegister(&local_500,'\x05');
  md::DataRegister::DataRegister(&local_4f0,'\x06');
  md::DataRegister::DataRegister(&local_4e0,'\a');
  local_4d0 = &local_550;
  local_4c8 = 8;
  std::allocator<md::DataRegister>::allocator(&local_551);
  __l_00._M_len = local_4c8;
  __l_00._M_array = local_4d0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_4c0,__l_00,&local_551);
  md::AddressRegister::AddressRegister(&local_5f0,'\0');
  md::AddressRegister::AddressRegister(&local_5e0,'\x01');
  md::AddressRegister::AddressRegister(&local_5d0,'\x02');
  md::AddressRegister::AddressRegister(&local_5c0,'\x03');
  md::AddressRegister::AddressRegister(&local_5b0,'\x04');
  md::AddressRegister::AddressRegister(&local_5a0,'\x05');
  md::AddressRegister::AddressRegister(&local_590,'\x06');
  local_580 = &local_5f0;
  local_578 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_5f1);
  __l._M_len = local_578;
  __l._M_array = local_580;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_570,__l,&local_5f1);
  md::Code::movem_from_stack((Code *)local_1d8,&local_4c0,&local_570);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_570);
  std::allocator<md::AddressRegister>::~allocator(&local_5f1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_4c0);
  std::allocator<md::DataRegister>::~allocator(&local_551);
  md::Code::rts((Code *)local_1d8);
  pIVar2 = World::item((World *)func_pre_use._labels._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,'+');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"",&local_619);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_1d8,&local_618);
  (*pIVar2->_vptr_Item[3])(pIVar2,(ulong)uVar1);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  md::Code::~Code((Code *)local_1d8);
  md::Code::~Code((Code *)local_90);
  return;
}

Assistant:

static void add_teleport_to_golas_heart(md::ROM& rom, World& world)
{
    md::Code func_pre_use;
    func_pre_use.cmpiw(MAP_MASSAN_CAVE_806, addr_(0xFF1204));
    func_pre_use.bne("regular_test");
    {
        func_pre_use.cmpiw(0x2514, addr_(0xFF5400));
        func_pre_use.bne("regular_test");
        {
            func_pre_use.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS_HAS_POST_USE);
        }
    }
    func_pre_use.label("regular_test");
    func_pre_use.jmp(world.item(ITEM_GOLA_EYE)->pre_use_address()); // Regular Gola's Eye test

    world.item(ITEM_GOLA_EYE)->pre_use_address(rom.inject_code(func_pre_use));

    // ---------------------------------------------------------------------------------------

    md::Code func_post_use;
    func_post_use.cmpiw(MAP_MASSAN_CAVE_806, addr_(0xFF1204));
    func_post_use.beq("tp_to_golas_heart");
    {
        func_post_use.jmp(world.item(ITEM_GOLA_EYE)->post_use_address()); // Regular Gola's Eye test
    }
    func_post_use.label("tp_to_golas_heart");
    func_post_use.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
    {
        func_post_use.trap(0, { 0x00, 0x07 }); // Play save game music
        func_post_use.jsr(0x29046); // Sleep_0 for 0x17 frames
        func_post_use.add_word(0x0000);
        func_post_use.jsr(0x852); // Restore BGM
        func_post_use.jsr(0x1592); // Save game to SRAM
        func_post_use.andib(0xF0, addr_(0xFF1052)); // Remove Spell Book
        func_post_use.addib(0x01, addr_(0xFF1052)); // ^^^
        func_post_use.andib(0x0F, addr_(0xFF1051)); // Remove Record Book
        func_post_use.addib(0x10, addr_(0xFF1051)); // ^^^
        func_post_use.movew(0x2F11, addr_(0xFF5400));
        func_post_use.movew(0x0708, addr_(0xFF5402)); // Reset subtiles position
        func_post_use.moveb(0x88, addr_(0xFF5404)); // Orientation
        func_post_use.trap(0, { 0x00, 0x4D });
        func_post_use.jsr(0x44C);
        func_post_use.movew(MAP_GOLAS_HEART_1, reg_D0); // Set MapID to Gola's Heart map
        func_post_use.movew(0x0000, addr_(0xFF5412)); // Reset player height
        func_post_use.moveb(0x00, addr_(0xFF5422)); // Reset ground height
        func_post_use.moveb(0x00, addr_(0xFF5439)); // ^
        func_post_use.jsr(0x1586E);
        func_post_use.jsr(0x434);
        func_post_use.clrb(reg_D0);
        func_post_use.jsr(0x2824);
        func_post_use.jsr(0x410);
        func_post_use.jsr(0x8EB4);
    }
    func_post_use.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
    func_post_use.rts();

    world.item(ITEM_GOLA_EYE)->post_use_address(rom.inject_code(func_post_use));
}